

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode deflate_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  z_stream *z;
  zlib_writer *zp;
  size_t nbytes_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  if (((type & 1U) == 0) || (nbytes == 0)) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  }
  else {
    writer[1].next = (Curl_cwriter *)buf;
    *(int *)&writer[1].ctx = (int)nbytes;
    if (*(int *)&writer[1].cwt == 3) {
      data_local._4_4_ = process_trailer(data,(zlib_writer *)writer);
    }
    else {
      data_local._4_4_ = inflate_stream(data,writer,type,ZLIB_INFLATING);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode deflate_do_write(struct Curl_easy *data,
                                       struct Curl_cwriter *writer, int type,
                                       const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  if(zp->zlib_init == ZLIB_EXTERNAL_TRAILER)
    return process_trailer(data, zp);

  /* Now uncompress the data */
  return inflate_stream(data, writer, type, ZLIB_INFLATING);
}